

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O2

void __thiscall asmjit::v1_14::Zone::reset(Zone *this,ResetPolicy resetPolicy)

{
  Zone ZVar1;
  Block *pBVar2;
  Block *pBVar3;
  Block *pBVar4;
  
  pBVar3 = *(Block **)(this + 0x10);
  if (pBVar3 != (Block *)_zeroBlock) {
    if (resetPolicy != kHard) {
      do {
        pBVar4 = pBVar3;
        pBVar3 = pBVar4->prev;
      } while (pBVar3 != (Block *)0x0);
      Zone_assignBlock(this,pBVar4);
      return;
    }
    ZVar1 = this[0x1b];
    *(char **)this =
         "/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/zone.cpp"
    ;
    *(char **)(this + 8) =
         "/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/zone.cpp"
    ;
    *(undefined1 **)(this + 0x10) = _zeroBlock;
    *(ulong *)(this + 0x20) = (ulong)(ZVar1 != (Zone)0x0);
    pBVar4 = pBVar3->next;
    do {
      pBVar2 = pBVar3->prev;
      if (pBVar2 == (Block *)0x0 && ZVar1 != (Zone)0x0) {
        pBVar3->prev = (Block *)0x0;
        pBVar3->next = (Block *)0x0;
        Zone_assignBlock(this,pBVar3);
        break;
      }
      free(pBVar3);
      pBVar3 = pBVar2;
    } while (pBVar2 != (Block *)0x0);
    while (pBVar4 != (Block *)0x0) {
      pBVar3 = pBVar4->next;
      free(pBVar4);
      pBVar4 = pBVar3;
    }
  }
  return;
}

Assistant:

void Zone::reset(ResetPolicy resetPolicy) noexcept {
  Block* cur = _block;

  // Can't be altered.
  if (cur == &_zeroBlock) {
    return;
  }

  if (resetPolicy == ResetPolicy::kHard) {
    bool hasStatic = hasStaticBlock();
    Block* initial = const_cast<Zone::Block*>(&_zeroBlock);

    _ptr = initial->data();
    _end = initial->data();
    _block = initial;
    _blockCount = size_t(hasStatic);

    // Since cur can be in the middle of the double-linked list, we have to traverse both directions (`prev` and
    // `next`) separately to visit all.
    Block* next = cur->next;
    do {
      Block* prev = cur->prev;

      if (prev == nullptr && hasStatic) {
        // If this is the first block and this Zone is actually a ZoneTmp then the first block cannot be freed.
        cur->prev = nullptr;
        cur->next = nullptr;
        Zone_assignBlock(this, cur);
        break;
      }

      ::free(cur);
      cur = prev;
    } while (cur);

    cur = next;
    while (cur) {
      next = cur->next;
      ::free(cur);
      cur = next;
    }
  }
  else {
    while (cur->prev) {
      cur = cur->prev;
    }
    Zone_assignBlock(this, cur);
  }
}